

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::UnitTestOptions::FilterMatchesTest(string *test_case_name,string *test_name)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  string *this;
  allocator<char> local_99;
  string positive;
  string negative;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&positive,test_case_name,".");
  std::operator+(&local_38,&positive,(test_name->_M_dataplus)._M_p);
  std::__cxx11::string::~string((string *)&positive);
  pcVar1 = FLAGS_gtest_filter_abi_cxx11_;
  pcVar3 = strchr(FLAGS_gtest_filter_abi_cxx11_,0x2d);
  positive._M_dataplus._M_p = (pointer)&positive.field_2;
  positive._M_string_length = 0;
  negative._M_dataplus._M_p = (pointer)&negative.field_2;
  negative._M_string_length = 0;
  positive.field_2._M_local_buf[0] = '\0';
  negative.field_2._M_local_buf[0] = '\0';
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::assign((char *)&positive);
    this = &negative;
  }
  else {
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar1,pcVar3);
    this = &positive;
    std::__cxx11::string::operator=((string *)this,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar3 + 1,&local_99);
    std::__cxx11::string::operator=((string *)&negative,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    if (positive._M_string_length != 0) goto LAB_0012852b;
  }
  std::__cxx11::string::assign((char *)this);
LAB_0012852b:
  bVar2 = MatchesFilter(&local_38,positive._M_dataplus._M_p);
  if (bVar2) {
    bVar2 = MatchesFilter(&local_38,negative._M_dataplus._M_p);
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&negative);
  std::__cxx11::string::~string((string *)&positive);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar2;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string &test_case_name,
                                        const std::string &test_name) {
  const std::string& full_name = test_case_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == NULL) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}